

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O0

ngx_int_t ngx_radix32tree_insert(ngx_radix_tree_t *tree,uint32_t key,uint32_t mask,uintptr_t value)

{
  ngx_radix_node_t *pnVar1;
  ngx_radix_node_t *local_40;
  ngx_radix_node_t *next;
  ngx_radix_node_t *node;
  uint32_t bit;
  uintptr_t value_local;
  uint32_t mask_local;
  uint32_t key_local;
  ngx_radix_tree_t *tree_local;
  
  node._4_4_ = 0x80000000;
  next = tree->root;
  local_40 = tree->root;
  for (; (node._4_4_ & mask) != 0; node._4_4_ = node._4_4_ >> 1) {
    if ((key & node._4_4_) == 0) {
      local_40 = next->left;
    }
    else {
      local_40 = next->right;
    }
    if (local_40 == (ngx_radix_node_t *)0x0) break;
    next = local_40;
  }
  if (local_40 == (ngx_radix_node_t *)0x0) {
    for (; (node._4_4_ & mask) != 0; node._4_4_ = node._4_4_ >> 1) {
      pnVar1 = ngx_radix_alloc(tree);
      if (pnVar1 == (ngx_radix_node_t *)0x0) {
        return -1;
      }
      pnVar1->right = (ngx_radix_node_t *)0x0;
      pnVar1->left = (ngx_radix_node_t *)0x0;
      pnVar1->parent = next;
      pnVar1->value = 0xffffffffffffffff;
      if ((key & node._4_4_) == 0) {
        next->left = pnVar1;
      }
      else {
        next->right = pnVar1;
      }
      next = pnVar1;
    }
    next->value = value;
    tree_local = (ngx_radix_tree_t *)0x0;
  }
  else if (next->value == 0xffffffffffffffff) {
    next->value = value;
    tree_local = (ngx_radix_tree_t *)0x0;
  }
  else {
    tree_local = (ngx_radix_tree_t *)0xfffffffffffffffd;
  }
  return (ngx_int_t)tree_local;
}

Assistant:

ngx_int_t
ngx_radix32tree_insert(ngx_radix_tree_t *tree, uint32_t key, uint32_t mask,
    uintptr_t value)
{
    uint32_t           bit;
    ngx_radix_node_t  *node, *next;

    bit = 0x80000000;

    node = tree->root;
    next = tree->root;

    while (bit & mask) {
        if (key & bit) {
            next = node->right;

        } else {
            next = node->left;
        }

        if (next == NULL) {
            break;
        }

        bit >>= 1;
        node = next;
    }

    if (next) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            return NGX_BUSY;
        }

        node->value = value;
        return NGX_OK;
    }

    while (bit & mask) {
        next = ngx_radix_alloc(tree);
        if (next == NULL) {
            return NGX_ERROR;
        }

        next->right = NULL;
        next->left = NULL;
        next->parent = node;
        next->value = NGX_RADIX_NO_VALUE;

        if (key & bit) {
            node->right = next;

        } else {
            node->left = next;
        }

        bit >>= 1;
        node = next;
    }

    node->value = value;

    return NGX_OK;
}